

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

string * __thiscall
gnuplotio::Gnuplot::
file<boost::tuples::tuple<std::array<int,3ul>&,boost::array<int,3ul>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,Gnuplot *this,string *arg,string *filename)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  undefined1 local_3e8 [8];
  ostringstream cmdline;
  long local_260;
  fstream tmp_stream;
  undefined1 local_250 [512];
  string local_50;
  string *local_30;
  string *filename_local;
  tuple<std::array<int,_3UL>_&,_boost::array<int,_3UL>_&,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *arg_local;
  Gnuplot *this_local;
  string *local_10;
  
  local_30 = filename;
  filename_local = arg;
  arg_local = (tuple<std::array<int,_3UL>_&,_boost::array<int,_3UL>_&,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
               *)this;
  local_10 = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    make_tmpfile_abi_cxx11_(&local_50,this);
    std::__cxx11::string::operator=(filename,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::fstream::fstream(&local_260,pcVar2,_S_out);
  std::ios::copyfmt((ios *)((long)&local_260 + *(long *)(local_260 + -0x18)));
  top_level_array_sender<boost::tuples::tuple<std::array<int,3ul>&,boost::array<int,3ul>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,gnuplotio::Mode1D,gnuplotio::ModeText>
            (local_250,filename_local);
  std::fstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
  poVar3 = std::operator<<((ostream *)local_3e8," \'");
  poVar3 = std::operator<<(poVar3,filename);
  std::operator<<(poVar3,"\' ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
  std::fstream::~fstream(&local_260);
  return __return_storage_ptr__;
}

Assistant:

std::string file(const T &arg, std::string filename, OrganizationMode) {
        if(filename.empty()) filename = make_tmpfile();
        std::fstream tmp_stream(filename.c_str(), std::fstream::out);
        tmp_stream.copyfmt(*this);
        top_level_array_sender(tmp_stream, arg, OrganizationMode(), ModeText());
        tmp_stream.close();

        std::ostringstream cmdline;
        // FIXME - hopefully filename doesn't contain quotes or such...
        cmdline << " '" << filename << "' ";
        return cmdline.str();
    }